

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableGcCompactTransientBuffers(ImGuiTable *table)

{
  ImGuiTableColumnSortSpecs *ptr;
  char *ptr_00;
  ImGuiContext *pIVar1;
  long lVar2;
  long lVar3;
  
  pIVar1 = GImGui;
  (table->SortSpecs).Specs = (ImGuiTableColumnSortSpecs *)0x0;
  ptr = (table->SortSpecsMulti).Data;
  if (ptr != (ImGuiTableColumnSortSpecs *)0x0) {
    (table->SortSpecsMulti).Size = 0;
    (table->SortSpecsMulti).Capacity = 0;
    MemFree(ptr);
    (table->SortSpecsMulti).Data = (ImGuiTableColumnSortSpecs *)0x0;
  }
  table->IsSortSpecsDirty = true;
  ptr_00 = (table->ColumnsNames).Buf.Data;
  if (ptr_00 != (char *)0x0) {
    (table->ColumnsNames).Buf.Size = 0;
    (table->ColumnsNames).Buf.Capacity = 0;
    MemFree(ptr_00);
    (table->ColumnsNames).Buf.Data = (char *)0x0;
  }
  table->MemoryCompacted = true;
  if (0 < table->ColumnsCount) {
    lVar2 = 0x50;
    lVar3 = 0;
    do {
      *(undefined2 *)((long)&((table->Columns).Data)->Flags + lVar2) = 0xffff;
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x68;
    } while (lVar3 < table->ColumnsCount);
  }
  (pIVar1->TablesLastTimeActive).Data
  [(int)((ulong)((long)table - (long)(pIVar1->Tables).Buf.Data) >> 3) * 0x7a44c6b] = -1.0;
  return;
}

Assistant:

void ImGui::TableGcCompactTransientBuffers(ImGuiTable* table)
{
    //IMGUI_DEBUG_PRINT("TableGcCompactTransientBuffers() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->MemoryCompacted == false);
    table->SortSpecs.Specs = NULL;
    table->SortSpecsMulti.clear();
    table->IsSortSpecsDirty = true; // FIXME: shouldn't have to leak into user performing a sort
    table->ColumnsNames.clear();
    table->MemoryCompacted = true;
    for (int n = 0; n < table->ColumnsCount; n++)
        table->Columns[n].NameOffset = -1;
    g.TablesLastTimeActive[g.Tables.GetIndex(table)] = -1.0f;
}